

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

long duckdb::TryCastCInternal<unsigned_short,long,duckdb::TryCast>
               (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  unsigned_short uVar2;
  long result_value;
  undefined1 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffc9;
  undefined2 in_stack_ffffffffffffffca;
  undefined4 in_stack_ffffffffffffffcc;
  undefined6 in_stack_ffffffffffffffd0;
  uint16_t in_stack_ffffffffffffffd6;
  undefined8 local_28;
  undefined8 local_8;
  
  uVar2 = UnsafeFetch<unsigned_short>
                    ((duckdb_result *)CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),
                     CONCAT44(in_stack_ffffffffffffffcc,
                              CONCAT22(in_stack_ffffffffffffffca,
                                       CONCAT11(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8)
                                      )),0x193b847);
  bVar1 = TryCast::Operation<unsigned_short,long>
                    (in_stack_ffffffffffffffd6,
                     (int64_t *)
                     CONCAT44(in_stack_ffffffffffffffcc,
                              CONCAT22(uVar2,CONCAT11(in_stack_ffffffffffffffc9,
                                                      in_stack_ffffffffffffffc8))),false);
  if (bVar1) {
    local_8 = local_28;
  }
  else {
    local_8 = FetchDefaultValue::Operation<long>();
  }
  return local_8;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}